

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2edge_tessellator.cc
# Opt level: O0

void __thiscall
S2EdgeTessellator::AppendUnprojected
          (S2EdgeTessellator *this,R2Point *pa,S2Point *a,R2Point *pb_in,S2Point *b,
          vector<Vector3<double>,_std::allocator<Vector3<double>_>_> *vertices)

{
  bool bVar1;
  S1ChordAngle x;
  undefined1 local_80 [8];
  S2Point mid;
  R2Point pmid;
  undefined1 local_48 [8];
  R2Point pb;
  vector<Vector3<double>,_std::allocator<Vector3<double>_>_> *vertices_local;
  S2Point *b_local;
  R2Point *pb_in_local;
  S2Point *a_local;
  R2Point *pa_local;
  S2EdgeTessellator *this_local;
  
  pb.c_[1] = (VType)vertices;
  _local_48 = S2::Projection::WrapDestination(this->proj_,pa,pb_in);
  x = EstimateMaxError(this,pa,a,(R2Point *)local_48,b);
  bVar1 = operator<=(x,(S1ChordAngle)(this->scaled_tolerance_).length2_);
  if (bVar1) {
    std::vector<Vector3<double>,_std::allocator<Vector3<double>_>_>::push_back
              ((vector<Vector3<double>,_std::allocator<Vector3<double>_>_> *)pb.c_[1],b);
  }
  else {
    (*this->proj_->_vptr_Projection[6])(0x3fe0000000000000,this->proj_,pa,local_48);
    (*this->proj_->_vptr_Projection[3])(local_80,this->proj_,mid.c_ + 2);
    AppendUnprojected(this,pa,a,(R2Point *)(mid.c_ + 2),(S2Point *)local_80,
                      (vector<Vector3<double>,_std::allocator<Vector3<double>_>_> *)pb.c_[1]);
    AppendUnprojected(this,(R2Point *)(mid.c_ + 2),(S2Point *)local_80,(R2Point *)local_48,b,
                      (vector<Vector3<double>,_std::allocator<Vector3<double>_>_> *)pb.c_[1]);
  }
  return;
}

Assistant:

void S2EdgeTessellator::AppendUnprojected(
    const R2Point& pa, const S2Point& a,
    const R2Point& pb_in, const S2Point& b, vector<S2Point>* vertices) const {
  // See notes above regarding measuring the interpolation error.
  R2Point pb = proj_.WrapDestination(pa, pb_in);
  if (EstimateMaxError(pa, a, pb, b) <= scaled_tolerance_) {
    vertices->push_back(b);
  } else {
    R2Point pmid = proj_.Interpolate(0.5, pa, pb);
    S2Point mid = proj_.Unproject(pmid);
    AppendUnprojected(pa, a, pmid, mid, vertices);
    AppendUnprojected(pmid, mid, pb, b, vertices);
  }
}